

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_DestroyWindow(ImGuiViewport *viewport)

{
  ImGuiViewportDataGlfw *p;
  
  p = (ImGuiViewportDataGlfw *)viewport->PlatformUserData;
  if (p != (ImGuiViewportDataGlfw *)0x0) {
    if (p->WindowOwned == true) {
      glfwDestroyWindow(p->Window);
    }
    p->Window = (GLFWwindow *)0x0;
    IM_DELETE<ImGuiViewportDataGlfw>(p);
  }
  viewport->PlatformUserData = (void *)0x0;
  viewport->PlatformHandle = (void *)0x0;
  return;
}

Assistant:

static void ImGui_ImplGlfw_DestroyWindow(ImGuiViewport* viewport)
{
    if (ImGuiViewportDataGlfw* data = (ImGuiViewportDataGlfw*)viewport->PlatformUserData)
    {
        if (data->WindowOwned)
        {
#if GLFW_HAS_GLFW_HOVERED && defined(_WIN32)
            HWND hwnd = (HWND)viewport->PlatformHandleRaw;
            ::RemovePropA(hwnd, "IMGUI_VIEWPORT");
#endif
            glfwDestroyWindow(data->Window);
        }
        data->Window = NULL;
        IM_DELETE(data);
    }
    viewport->PlatformUserData = viewport->PlatformHandle = NULL;
}